

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestRacingTailCaller::foo(TestRacingTailCaller *this,FooContext context)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  SourceLocation location;
  OwnPromiseNode OVar3;
  void *pvVar4;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:982:25)>
  *location_00;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  anon_class_8_1_bc11688f_for_func local_68;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_60;
  code *local_58;
  OwnPromiseNode local_50;
  undefined *local_48;
  undefined *puStack_40;
  undefined8 local_38;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_30;
  
  local_58 = kj::_::
             SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:982:25)>
             ::anon_class_8_1_bc11688f_for_func::operator();
  pp_Var1 = context.hook[1]._vptr_CallContextHook;
  p_Var2 = pp_Var1[1];
  if (p_Var2 == (_func_int *)0x0 || (ulong)((long)pp_Var1 - (long)p_Var2) < 0x28) {
    pvVar4 = operator_new(0x400);
    location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:982:25)>
                   *)((long)pvVar4 + 0x3d8);
    kj::
    ctor<kj::_::SimpleTransformPromiseNode<void,capnp::_::(anonymous_namespace)::TestRacingTailCaller::foo(capnp::CallContext<capnproto_test::capnp::test::TestTailCaller::FooParams,capnproto_test::capnp::test::TestTailCallee::TailResult>)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::_::(anonymous_namespace)::TestRacingTailCaller::foo(capnp::CallContext<capnproto_test::capnp::test::TestTailCaller::FooParams,capnproto_test::capnp::test::TestTailCallee::TailResult>)::_lambda()_1_,void*&>
              (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(context.hook + 1),
               &local_68,&local_58);
    *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
  }
  else {
    pp_Var1[1] = (_func_int *)0x0;
    location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:982:25)>
                   *)(pp_Var1 + -5);
    kj::
    ctor<kj::_::SimpleTransformPromiseNode<void,capnp::_::(anonymous_namespace)::TestRacingTailCaller::foo(capnp::CallContext<capnproto_test::capnp::test::TestTailCaller::FooParams,capnproto_test::capnp::test::TestTailCallee::TailResult>)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::_::(anonymous_namespace)::TestRacingTailCaller::foo(capnp::CallContext<capnproto_test::capnp::test::TestTailCaller::FooParams,capnproto_test::capnp::test::TestTailCallee::TailResult>)::_lambda()_1_,void*&>
              (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(context.hook + 1),
               &local_68,&local_58);
    pp_Var1[-4] = p_Var2;
  }
  local_48 = &DAT_0042a172;
  puStack_40 = &DAT_0042a1d1;
  local_38 = 0x4c0000058b;
  location.function = &DAT_0042a1d1;
  location.fileName = &DAT_0042a172;
  location.lineNumber = 0x58b;
  location.columnNumber = 0x4c;
  local_60.ptr = (PromiseNode *)location_00;
  kj::_::maybeChain<void>(&local_50,(Promise<void> *)&local_60,location);
  OVar3.ptr = local_50.ptr;
  local_50.ptr = (PromiseNode *)0x0;
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_50);
  (this->super_Server)._vptr_Server = (_func_int **)OVar3.ptr;
  local_30.ptr = (PromiseNode *)0x0;
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_30);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_60);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> foo(FooContext context) override {
    return unblock.then([context]() mutable {
      auto tailRequest = context.getParams().getCallee().fooRequest();
      return context.tailCall(kj::mv(tailRequest));
    });
  }